

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O3

void __thiscall
icu_63::RuleBasedBreakIterator::RuleBasedBreakIterator
          (RuleBasedBreakIterator *this,uint8_t *compiledRules,uint32_t ruleLength,
          UErrorCode *status)

{
  RBBIDataWrapper *this_00;
  UErrorCode *size;
  UnicodeString local_70;
  
  BreakIterator::BreakIterator(&this->super_BreakIterator);
  (this->super_BreakIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedBreakIterator_002454a0;
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00249818;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  StringCharacterIterator::StringCharacterIterator(&this->fSCharIter,&local_70);
  UnicodeString::~UnicodeString(&local_70);
  size = status;
  init(this,(EVP_PKEY_CTX *)status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((compiledRules == (uint8_t *)0x0 || ruleLength < 0x50) ||
       (ruleLength < *(uint *)(compiledRules + 8))) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      this_00 = (RBBIDataWrapper *)UMemory::operator_new((UMemory *)0x90,(size_t)size);
      if (this_00 == (RBBIDataWrapper *)0x0) {
        this->fData = (RBBIDataWrapper *)0x0;
        if ((this_00 == (RBBIDataWrapper *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
          *status = U_MEMORY_ALLOCATION_ERROR;
        }
      }
      else {
        RBBIDataWrapper::RBBIDataWrapper(this_00,(RBBIDataHeader *)compiledRules,kDontAdopt,status);
        this->fData = this_00;
      }
    }
  }
  return;
}

Assistant:

RuleBasedBreakIterator::RuleBasedBreakIterator(const uint8_t *compiledRules,
                       uint32_t       ruleLength,
                       UErrorCode     &status)
 : fSCharIter(UnicodeString())
{
    init(status);
    if (U_FAILURE(status)) {
        return;
    }
    if (compiledRules == NULL || ruleLength < sizeof(RBBIDataHeader)) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    const RBBIDataHeader *data = (const RBBIDataHeader *)compiledRules;
    if (data->fLength > ruleLength) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    fData = new RBBIDataWrapper(data, RBBIDataWrapper::kDontAdopt, status);
    if (U_FAILURE(status)) {return;}
    if(fData == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
}